

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcpconn.c
# Opt level: O1

void tcp_close(void *arg)

{
  nni_aio *aio;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0xa8));
  if (*(char *)((long)arg + 0xa0) == '\0') {
    *(undefined1 *)((long)arg + 0xa0) = 1;
    do {
      aio = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x70));
      if (aio == (nni_aio *)0x0) {
        aio = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x88));
        if (aio == (nni_aio *)0x0) goto LAB_0013b6e7;
      }
      nni_aio_list_remove(aio);
      nni_aio_finish_error(aio,NNG_ECLOSED);
    } while( true );
  }
LAB_0013b6f3:
  nni_mtx_unlock((nni_mtx *)((long)arg + 0xa8));
  return;
LAB_0013b6e7:
  nni_posix_pfd_close((nni_posix_pfd *)((long)arg + 0x38));
  goto LAB_0013b6f3;
}

Assistant:

static void
tcp_close(void *arg)
{
	nni_tcp_conn *c = arg;
	nni_mtx_lock(&c->mtx);
	if (!c->closed) {
		nni_aio *aio;
		c->closed = true;
		while (((aio = nni_list_first(&c->readq)) != NULL) ||
		    ((aio = nni_list_first(&c->writeq)) != NULL)) {
			nni_aio_list_remove(aio);
			nni_aio_finish_error(aio, NNG_ECLOSED);
		}
		nni_posix_pfd_close(&c->pfd);
	}
	nni_mtx_unlock(&c->mtx);
}